

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readoldpsm.c
# Opt level: O3

int it_old_psm_read_samples(IT_SAMPLE **sample,DUMBFILE *f,int *num)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  byte bVar30;
  IT_SAMPLE *pIVar31;
  undefined1 auVar32 [16];
  int32 iVar33;
  char *ptr;
  IT_SAMPLE *pIVar34;
  void *pvVar35;
  long lVar36;
  char cVar37;
  void **ppvVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  short sVar42;
  ushort uVar43;
  ulong uVar44;
  short sVar45;
  int32 n;
  size_t __nmemb;
  size_t sVar46;
  long lVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar59;
  int iVar61;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  long lVar60;
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  int iVar82;
  int iVar83;
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  int iVar96;
  int iVar100;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  long lVar63;
  
  uVar41 = *num;
  __nmemb = (size_t)(int)uVar41;
  ptr = (char *)malloc(__nmemb << 6);
  if (ptr == (char *)0x0) {
    return -1;
  }
  n = (int32)(__nmemb << 6);
  iVar33 = dumbfile_getnc(ptr,n,f);
  if (iVar33 < n) {
LAB_0070e2d6:
    free(ptr);
    iVar59 = -1;
  }
  else {
    if ((int)uVar41 < 1) {
      uVar40 = 0;
    }
    else {
      lVar36 = 0;
      uVar40 = 0;
      do {
        if ((ptr[lVar36 + 0x2e] != '\0') || (uVar43 = (ushort)(byte)ptr[lVar36 + 0x2d], uVar43 == 0)
           ) goto LAB_0070e2d6;
        if (uVar40 <= uVar43) {
          uVar40 = (uint)uVar43;
        }
        lVar36 = lVar36 + 0x40;
      } while ((ulong)uVar41 << 6 != lVar36);
    }
    uVar39 = (ulong)uVar40;
    if ((int)uVar41 < (int)uVar40) {
      pIVar34 = (IT_SAMPLE *)realloc(*sample,uVar39 * 0x68);
      auVar50 = _DAT_0073b300;
      auVar32 = _DAT_0073b2f0;
      if (pIVar34 == (IT_SAMPLE *)0x0) goto LAB_0070e2d6;
      lVar36 = (uVar39 - __nmemb) + -1;
      auVar48._8_4_ = (int)lVar36;
      auVar48._0_8_ = lVar36;
      auVar48._12_4_ = (int)((ulong)lVar36 >> 0x20);
      ppvVar38 = &pIVar34[__nmemb + 1].data;
      uVar44 = 0;
      auVar48 = auVar48 ^ _DAT_0073b300;
      do {
        auVar66._8_4_ = (int)uVar44;
        auVar66._0_8_ = uVar44;
        auVar66._12_4_ = (int)(uVar44 >> 0x20);
        auVar66 = (auVar66 | auVar32) ^ auVar50;
        if ((bool)(~(auVar66._4_4_ == auVar48._4_4_ && auVar48._0_4_ < auVar66._0_4_ ||
                    auVar48._4_4_ < auVar66._4_4_) & 1)) {
          ppvVar38[-0xd] = (void *)0x0;
        }
        if ((auVar66._12_4_ != auVar48._12_4_ || auVar66._8_4_ <= auVar48._8_4_) &&
            auVar66._12_4_ <= auVar48._12_4_) {
          *ppvVar38 = (void *)0x0;
        }
        uVar44 = uVar44 + 2;
        ppvVar38 = ppvVar38 + 0x1a;
      } while (((uVar39 - __nmemb) + 1 & 0xfffffffffffffffe) != uVar44);
      *sample = pIVar34;
      *num = uVar40;
    }
    qsort(ptr,__nmemb,0x40,psm_sample_compare);
    auVar32 = _DAT_0073b300;
    if (uVar40 != 0) {
      pIVar34 = *sample;
      lVar36 = uVar39 - 1;
      auVar49._8_4_ = (int)lVar36;
      auVar49._0_8_ = lVar36;
      auVar49._12_4_ = (int)((ulong)lVar36 >> 0x20);
      lVar36 = 0;
      auVar50 = auVar49;
      auVar62 = _DAT_0073c3b0;
      auVar64 = _DAT_0073c3c0;
      auVar65 = _DAT_0073c3d0;
      auVar67 = _DAT_0073c3e0;
      auVar68 = _DAT_0073c180;
      auVar69 = _DAT_0073c190;
      auVar70 = _DAT_0073c1a0;
      auVar71 = _DAT_0073b2f0;
      do {
        auVar48 = auVar49 ^ auVar32;
        auVar66 = auVar71 ^ auVar32;
        iVar59 = auVar48._0_4_;
        iVar96 = -(uint)(iVar59 < auVar66._0_4_);
        iVar61 = auVar48._4_4_;
        auVar85._4_4_ = -(uint)(iVar61 < auVar66._4_4_);
        iVar82 = auVar48._8_4_;
        iVar100 = -(uint)(iVar82 < auVar66._8_4_);
        iVar83 = auVar48._12_4_;
        auVar85._12_4_ = -(uint)(iVar83 < auVar66._12_4_);
        auVar72._4_4_ = iVar96;
        auVar72._0_4_ = iVar96;
        auVar72._8_4_ = iVar100;
        auVar72._12_4_ = iVar100;
        auVar48 = pshuflw(auVar50,auVar72,0xe8);
        auVar84._4_4_ = -(uint)(auVar66._4_4_ == iVar61);
        auVar84._12_4_ = -(uint)(auVar66._12_4_ == iVar83);
        auVar84._0_4_ = auVar84._4_4_;
        auVar84._8_4_ = auVar84._12_4_;
        auVar72 = pshuflw(in_XMM11,auVar84,0xe8);
        auVar85._0_4_ = auVar85._4_4_;
        auVar85._8_4_ = auVar85._12_4_;
        auVar66 = pshuflw(auVar48,auVar85,0xe8);
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        auVar50 = (auVar66 | auVar72 & auVar48) ^ auVar50;
        auVar50 = packssdw(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pIVar34->filename[lVar36 + 0xf] = '\0';
        }
        auVar16._4_4_ = iVar96;
        auVar16._0_4_ = iVar96;
        auVar16._8_4_ = iVar100;
        auVar16._12_4_ = iVar100;
        auVar85 = auVar84 & auVar16 | auVar85;
        auVar50 = packssdw(auVar85,auVar85);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar6,auVar50 ^ auVar6);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._0_4_ >> 8 & 1) != 0) {
          pIVar34[1].filename[lVar36 + 0xf] = '\0';
        }
        auVar50 = auVar70 ^ auVar32;
        auVar73._0_4_ = -(uint)(iVar59 < auVar50._0_4_);
        auVar73._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar73._8_4_ = -(uint)(iVar82 < auVar50._8_4_);
        auVar73._12_4_ = -(uint)(iVar83 < auVar50._12_4_);
        auVar86._4_4_ = auVar73._0_4_;
        auVar86._0_4_ = auVar73._0_4_;
        auVar86._8_4_ = auVar73._8_4_;
        auVar86._12_4_ = auVar73._8_4_;
        iVar96 = -(uint)(auVar50._4_4_ == iVar61);
        iVar100 = -(uint)(auVar50._12_4_ == iVar83);
        auVar17._4_4_ = iVar96;
        auVar17._0_4_ = iVar96;
        auVar17._8_4_ = iVar100;
        auVar17._12_4_ = iVar100;
        auVar97._4_4_ = auVar73._4_4_;
        auVar97._0_4_ = auVar73._4_4_;
        auVar97._8_4_ = auVar73._12_4_;
        auVar97._12_4_ = auVar73._12_4_;
        auVar50 = auVar17 & auVar86 | auVar97;
        auVar50 = packssdw(auVar50,auVar50);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar7,auVar50 ^ auVar7);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._0_4_ >> 0x10 & 1) != 0) {
          pIVar34[2].filename[lVar36 + 0xf] = '\0';
        }
        auVar50 = pshufhw(auVar50,auVar86,0x84);
        auVar18._4_4_ = iVar96;
        auVar18._0_4_ = iVar96;
        auVar18._8_4_ = iVar100;
        auVar18._12_4_ = iVar100;
        auVar66 = pshufhw(auVar73,auVar18,0x84);
        auVar48 = pshufhw(auVar50,auVar97,0x84);
        auVar51._8_4_ = 0xffffffff;
        auVar51._0_8_ = 0xffffffffffffffff;
        auVar51._12_4_ = 0xffffffff;
        auVar51 = (auVar48 | auVar66 & auVar50) ^ auVar51;
        auVar50 = packssdw(auVar51,auVar51);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._0_4_ >> 0x18 & 1) != 0) {
          pIVar34[3].filename[lVar36 + 0xf] = '\0';
        }
        auVar50 = auVar69 ^ auVar32;
        auVar74._0_4_ = -(uint)(iVar59 < auVar50._0_4_);
        auVar74._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar74._8_4_ = -(uint)(iVar82 < auVar50._8_4_);
        auVar74._12_4_ = -(uint)(iVar83 < auVar50._12_4_);
        auVar19._4_4_ = auVar74._0_4_;
        auVar19._0_4_ = auVar74._0_4_;
        auVar19._8_4_ = auVar74._8_4_;
        auVar19._12_4_ = auVar74._8_4_;
        auVar66 = pshuflw(auVar97,auVar19,0xe8);
        auVar52._0_4_ = -(uint)(auVar50._0_4_ == iVar59);
        auVar52._4_4_ = -(uint)(auVar50._4_4_ == iVar61);
        auVar52._8_4_ = -(uint)(auVar50._8_4_ == iVar82);
        auVar52._12_4_ = -(uint)(auVar50._12_4_ == iVar83);
        auVar87._4_4_ = auVar52._4_4_;
        auVar87._0_4_ = auVar52._4_4_;
        auVar87._8_4_ = auVar52._12_4_;
        auVar87._12_4_ = auVar52._12_4_;
        auVar50 = pshuflw(auVar52,auVar87,0xe8);
        auVar88._4_4_ = auVar74._4_4_;
        auVar88._0_4_ = auVar74._4_4_;
        auVar88._8_4_ = auVar74._12_4_;
        auVar88._12_4_ = auVar74._12_4_;
        auVar48 = pshuflw(auVar74,auVar88,0xe8);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 & auVar66,(auVar48 | auVar50 & auVar66) ^ auVar8);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pIVar34[4].filename[lVar36 + 0xf] = '\0';
        }
        auVar20._4_4_ = auVar74._0_4_;
        auVar20._0_4_ = auVar74._0_4_;
        auVar20._8_4_ = auVar74._8_4_;
        auVar20._12_4_ = auVar74._8_4_;
        auVar88 = auVar87 & auVar20 | auVar88;
        auVar48 = packssdw(auVar88,auVar88);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50,auVar48 ^ auVar9);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._4_2_ >> 8 & 1) != 0) {
          pIVar34[5].filename[lVar36 + 0xf] = '\0';
        }
        auVar50 = auVar68 ^ auVar32;
        auVar75._0_4_ = -(uint)(iVar59 < auVar50._0_4_);
        auVar75._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar75._8_4_ = -(uint)(iVar82 < auVar50._8_4_);
        auVar75._12_4_ = -(uint)(iVar83 < auVar50._12_4_);
        auVar89._4_4_ = auVar75._0_4_;
        auVar89._0_4_ = auVar75._0_4_;
        auVar89._8_4_ = auVar75._8_4_;
        auVar89._12_4_ = auVar75._8_4_;
        iVar96 = -(uint)(auVar50._4_4_ == iVar61);
        iVar100 = -(uint)(auVar50._12_4_ == iVar83);
        auVar21._4_4_ = iVar96;
        auVar21._0_4_ = iVar96;
        auVar21._8_4_ = iVar100;
        auVar21._12_4_ = iVar100;
        auVar98._4_4_ = auVar75._4_4_;
        auVar98._0_4_ = auVar75._4_4_;
        auVar98._8_4_ = auVar75._12_4_;
        auVar98._12_4_ = auVar75._12_4_;
        auVar50 = auVar21 & auVar89 | auVar98;
        auVar50 = packssdw(auVar50,auVar50);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar10,auVar50 ^ auVar10);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pIVar34[6].filename[lVar36 + 0xf] = '\0';
        }
        auVar50 = pshufhw(auVar50,auVar89,0x84);
        auVar22._4_4_ = iVar96;
        auVar22._0_4_ = iVar96;
        auVar22._8_4_ = iVar100;
        auVar22._12_4_ = iVar100;
        auVar66 = pshufhw(auVar75,auVar22,0x84);
        auVar48 = pshufhw(auVar50,auVar98,0x84);
        auVar53._8_4_ = 0xffffffff;
        auVar53._0_8_ = 0xffffffffffffffff;
        auVar53._12_4_ = 0xffffffff;
        auVar53 = (auVar48 | auVar66 & auVar50) ^ auVar53;
        auVar50 = packssdw(auVar53,auVar53);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._6_2_ >> 8 & 1) != 0) {
          pIVar34[7].filename[lVar36 + 0xf] = '\0';
        }
        auVar50 = auVar67 ^ auVar32;
        auVar76._0_4_ = -(uint)(iVar59 < auVar50._0_4_);
        auVar76._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar76._8_4_ = -(uint)(iVar82 < auVar50._8_4_);
        auVar76._12_4_ = -(uint)(iVar83 < auVar50._12_4_);
        auVar23._4_4_ = auVar76._0_4_;
        auVar23._0_4_ = auVar76._0_4_;
        auVar23._8_4_ = auVar76._8_4_;
        auVar23._12_4_ = auVar76._8_4_;
        auVar66 = pshuflw(auVar98,auVar23,0xe8);
        auVar54._0_4_ = -(uint)(auVar50._0_4_ == iVar59);
        auVar54._4_4_ = -(uint)(auVar50._4_4_ == iVar61);
        auVar54._8_4_ = -(uint)(auVar50._8_4_ == iVar82);
        auVar54._12_4_ = -(uint)(auVar50._12_4_ == iVar83);
        auVar90._4_4_ = auVar54._4_4_;
        auVar90._0_4_ = auVar54._4_4_;
        auVar90._8_4_ = auVar54._12_4_;
        auVar90._12_4_ = auVar54._12_4_;
        auVar50 = pshuflw(auVar54,auVar90,0xe8);
        auVar91._4_4_ = auVar76._4_4_;
        auVar91._0_4_ = auVar76._4_4_;
        auVar91._8_4_ = auVar76._12_4_;
        auVar91._12_4_ = auVar76._12_4_;
        auVar48 = pshuflw(auVar76,auVar91,0xe8);
        auVar77._8_4_ = 0xffffffff;
        auVar77._0_8_ = 0xffffffffffffffff;
        auVar77._12_4_ = 0xffffffff;
        auVar77 = (auVar48 | auVar50 & auVar66) ^ auVar77;
        auVar48 = packssdw(auVar77,auVar77);
        auVar50 = packsswb(auVar50 & auVar66,auVar48);
        if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pIVar34[8].filename[lVar36 + 0xf] = '\0';
        }
        auVar24._4_4_ = auVar76._0_4_;
        auVar24._0_4_ = auVar76._0_4_;
        auVar24._8_4_ = auVar76._8_4_;
        auVar24._12_4_ = auVar76._8_4_;
        auVar91 = auVar90 & auVar24 | auVar91;
        auVar48 = packssdw(auVar91,auVar91);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar48 = packssdw(auVar48 ^ auVar11,auVar48 ^ auVar11);
        auVar50 = packsswb(auVar50,auVar48);
        if ((auVar50._8_2_ >> 8 & 1) != 0) {
          pIVar34[9].filename[lVar36 + 0xf] = '\0';
        }
        auVar50 = auVar65 ^ auVar32;
        auVar78._0_4_ = -(uint)(iVar59 < auVar50._0_4_);
        auVar78._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar78._8_4_ = -(uint)(iVar82 < auVar50._8_4_);
        auVar78._12_4_ = -(uint)(iVar83 < auVar50._12_4_);
        auVar92._4_4_ = auVar78._0_4_;
        auVar92._0_4_ = auVar78._0_4_;
        auVar92._8_4_ = auVar78._8_4_;
        auVar92._12_4_ = auVar78._8_4_;
        iVar96 = -(uint)(auVar50._4_4_ == iVar61);
        iVar100 = -(uint)(auVar50._12_4_ == iVar83);
        auVar25._4_4_ = iVar96;
        auVar25._0_4_ = iVar96;
        auVar25._8_4_ = iVar100;
        auVar25._12_4_ = iVar100;
        auVar99._4_4_ = auVar78._4_4_;
        auVar99._0_4_ = auVar78._4_4_;
        auVar99._8_4_ = auVar78._12_4_;
        auVar99._12_4_ = auVar78._12_4_;
        auVar50 = auVar25 & auVar92 | auVar99;
        auVar50 = packssdw(auVar50,auVar50);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar12,auVar50 ^ auVar12);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pIVar34[10].filename[lVar36 + 0xf] = '\0';
        }
        auVar50 = pshufhw(auVar50,auVar92,0x84);
        auVar26._4_4_ = iVar96;
        auVar26._0_4_ = iVar96;
        auVar26._8_4_ = iVar100;
        auVar26._12_4_ = iVar100;
        auVar66 = pshufhw(auVar78,auVar26,0x84);
        auVar48 = pshufhw(auVar50,auVar99,0x84);
        auVar55._8_4_ = 0xffffffff;
        auVar55._0_8_ = 0xffffffffffffffff;
        auVar55._12_4_ = 0xffffffff;
        auVar55 = (auVar48 | auVar66 & auVar50) ^ auVar55;
        auVar50 = packssdw(auVar55,auVar55);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._10_2_ >> 8 & 1) != 0) {
          pIVar34[0xb].filename[lVar36 + 0xf] = '\0';
        }
        auVar50 = auVar64 ^ auVar32;
        auVar79._0_4_ = -(uint)(iVar59 < auVar50._0_4_);
        auVar79._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar79._8_4_ = -(uint)(iVar82 < auVar50._8_4_);
        auVar79._12_4_ = -(uint)(iVar83 < auVar50._12_4_);
        auVar27._4_4_ = auVar79._0_4_;
        auVar27._0_4_ = auVar79._0_4_;
        auVar27._8_4_ = auVar79._8_4_;
        auVar27._12_4_ = auVar79._8_4_;
        auVar66 = pshuflw(auVar99,auVar27,0xe8);
        auVar56._0_4_ = -(uint)(auVar50._0_4_ == iVar59);
        auVar56._4_4_ = -(uint)(auVar50._4_4_ == iVar61);
        auVar56._8_4_ = -(uint)(auVar50._8_4_ == iVar82);
        auVar56._12_4_ = -(uint)(auVar50._12_4_ == iVar83);
        auVar93._4_4_ = auVar56._4_4_;
        auVar93._0_4_ = auVar56._4_4_;
        auVar93._8_4_ = auVar56._12_4_;
        auVar93._12_4_ = auVar56._12_4_;
        auVar50 = pshuflw(auVar56,auVar93,0xe8);
        auVar94._4_4_ = auVar79._4_4_;
        auVar94._0_4_ = auVar79._4_4_;
        auVar94._8_4_ = auVar79._12_4_;
        auVar94._12_4_ = auVar79._12_4_;
        auVar48 = pshuflw(auVar79,auVar94,0xe8);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 & auVar66,(auVar48 | auVar50 & auVar66) ^ auVar13);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pIVar34[0xc].filename[lVar36 + 0xf] = '\0';
        }
        auVar28._4_4_ = auVar79._0_4_;
        auVar28._0_4_ = auVar79._0_4_;
        auVar28._8_4_ = auVar79._8_4_;
        auVar28._12_4_ = auVar79._8_4_;
        auVar94 = auVar93 & auVar28 | auVar94;
        auVar48 = packssdw(auVar94,auVar94);
        auVar14._8_4_ = 0xffffffff;
        auVar14._0_8_ = 0xffffffffffffffff;
        auVar14._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50,auVar48 ^ auVar14);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._12_2_ >> 8 & 1) != 0) {
          pIVar34[0xd].filename[lVar36 + 0xf] = '\0';
        }
        auVar50 = auVar62 ^ auVar32;
        auVar80._0_4_ = -(uint)(iVar59 < auVar50._0_4_);
        auVar80._4_4_ = -(uint)(iVar61 < auVar50._4_4_);
        auVar80._8_4_ = -(uint)(iVar82 < auVar50._8_4_);
        auVar80._12_4_ = -(uint)(iVar83 < auVar50._12_4_);
        auVar95._4_4_ = auVar80._0_4_;
        auVar95._0_4_ = auVar80._0_4_;
        auVar95._8_4_ = auVar80._8_4_;
        auVar95._12_4_ = auVar80._8_4_;
        iVar59 = -(uint)(auVar50._4_4_ == iVar61);
        iVar61 = -(uint)(auVar50._12_4_ == iVar83);
        auVar81._4_4_ = iVar59;
        auVar81._0_4_ = iVar59;
        auVar81._8_4_ = iVar61;
        auVar81._12_4_ = iVar61;
        auVar57._4_4_ = auVar80._4_4_;
        auVar57._0_4_ = auVar80._4_4_;
        auVar57._8_4_ = auVar80._12_4_;
        auVar57._12_4_ = auVar80._12_4_;
        auVar57 = auVar81 & auVar95 | auVar57;
        auVar50 = packssdw(auVar57,auVar57);
        auVar15._8_4_ = 0xffffffff;
        auVar15._0_8_ = 0xffffffffffffffff;
        auVar15._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar15,auVar50 ^ auVar15);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pIVar34[0xe].filename[lVar36 + 0xf] = '\0';
        }
        auVar50 = pshufhw(auVar50,auVar95,0x84);
        in_XMM11 = pshufhw(auVar80,auVar81,0x84);
        in_XMM11 = in_XMM11 & auVar50;
        auVar29._4_4_ = auVar80._4_4_;
        auVar29._0_4_ = auVar80._4_4_;
        auVar29._8_4_ = auVar80._12_4_;
        auVar29._12_4_ = auVar80._12_4_;
        auVar50 = pshufhw(auVar50,auVar29,0x84);
        auVar58._8_4_ = 0xffffffff;
        auVar58._0_8_ = 0xffffffffffffffff;
        auVar58._12_4_ = 0xffffffff;
        auVar58 = (auVar50 | in_XMM11) ^ auVar58;
        auVar50 = packssdw(auVar58,auVar58);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._14_2_ >> 8 & 1) != 0) {
          pIVar34[0xf].filename[lVar36 + 0xf] = '\0';
        }
        lVar47 = (long)DAT_0073c420;
        lVar63 = auVar71._8_8_;
        auVar71._0_8_ = auVar71._0_8_ + lVar47;
        lVar60 = DAT_0073c420._8_8_;
        auVar71._8_8_ = lVar63 + lVar60;
        lVar63 = auVar70._8_8_;
        auVar70._0_8_ = auVar70._0_8_ + lVar47;
        auVar70._8_8_ = lVar63 + lVar60;
        lVar63 = auVar69._8_8_;
        auVar69._0_8_ = auVar69._0_8_ + lVar47;
        auVar69._8_8_ = lVar63 + lVar60;
        lVar63 = auVar68._8_8_;
        auVar68._0_8_ = auVar68._0_8_ + lVar47;
        auVar68._8_8_ = lVar63 + lVar60;
        lVar63 = auVar67._8_8_;
        auVar67._0_8_ = auVar67._0_8_ + lVar47;
        auVar67._8_8_ = lVar63 + lVar60;
        lVar63 = auVar65._8_8_;
        auVar65._0_8_ = auVar65._0_8_ + lVar47;
        auVar65._8_8_ = lVar63 + lVar60;
        lVar63 = auVar64._8_8_;
        auVar64._0_8_ = auVar64._0_8_ + lVar47;
        auVar64._8_8_ = lVar63 + lVar60;
        lVar63 = auVar62._8_8_;
        auVar62._0_8_ = auVar62._0_8_ + lVar47;
        auVar62._8_8_ = lVar63 + lVar60;
        lVar36 = lVar36 + 0x680;
        auVar50 = _DAT_0073c420;
      } while ((uVar39 + 0xf >> 4) * 0x680 - lVar36 != 0);
    }
    if (0 < (int)uVar41) {
      sVar46 = 0;
      do {
        lVar36 = sVar46 * 0x40;
        uVar39 = (ulong)*(ushort *)(ptr + lVar36 + 0x2d);
        pIVar34 = *sample;
        uVar5 = *(undefined8 *)(ptr + lVar36);
        *(undefined8 *)(pIVar34[uVar39 - 1].filename + 5) = *(undefined8 *)(ptr + lVar36 + 5);
        *(undefined8 *)pIVar34[uVar39 - 1].filename = uVar5;
        pIVar34[uVar39 - 1].filename[0xd] = '\0';
        uVar5 = *(undefined8 *)(ptr + lVar36 + 0xd + 8);
        *(undefined8 *)pIVar34[uVar39 - 1].name = *(undefined8 *)(ptr + lVar36 + 0xd);
        *(undefined8 *)(pIVar34[uVar39 - 1].name + 8) = uVar5;
        *(undefined8 *)(pIVar34[uVar39 - 1].name + 0x10) = *(undefined8 *)(ptr + lVar36 + 0x1d);
        pIVar34[uVar39 - 1].name[0x18] = '\0';
        iVar59 = *(int *)(ptr + lVar36 + 0x25);
        uVar41 = *(uint *)(ptr + lVar36 + 0x30);
        bVar2 = ptr[lVar36 + 0x2f];
        pIVar34[uVar39 - 1].length = uVar41;
        uVar40 = *(uint *)(ptr + lVar36 + 0x34);
        pIVar34[uVar39 - 1].loop_start = uVar40;
        uVar4 = *(uint *)(ptr + lVar36 + 0x38);
        pIVar34[uVar39 - 1].loop_end = uVar4;
        if (0 < (int)uVar41) {
          bVar3 = ptr[lVar36 + 0x3c];
          pIVar34[uVar39 - 1].default_volume = ptr[lVar36 + 0x3d];
          pIVar34[uVar39 - 1].C5_speed = (uint)*(ushort *)(ptr + lVar36 + 0x3e);
          uVar43 = bVar3 & 0xf;
          if ((bVar3 & 0xf) == 0) {
            sVar42 = 0;
          }
          else {
            sVar45 = uVar43 * 0x20;
            sVar42 = sVar45 + -0x200;
            if ((byte)uVar43 < 8) {
              sVar42 = sVar45;
            }
          }
          pIVar34[uVar39 - 1].finetune = sVar42;
          bVar3 = pIVar34[uVar39 - 1].flags;
          pIVar34[uVar39 - 1].flags = bVar3 | 1;
          if ((bVar2 & 0x41) == 0) {
            bVar30 = bVar3 | 0x41;
            if ((bVar2 & 0x20) == 0) {
              bVar30 = bVar3 | 1;
            }
            bVar3 = bVar30 | 2;
            if ((bVar2 & 4) == 0) {
              bVar3 = bVar30;
            }
            if ((bVar2 & 0x24) != 0) {
              pIVar34[uVar39 - 1].flags = bVar3;
            }
            if ((char)bVar2 < '\0') {
              pIVar34[uVar39 - 1].flags = bVar3 | 0x10;
              if (uVar41 < uVar4) {
                pIVar34[uVar39 - 1].loop_end = uVar41;
              }
              else if (uVar40 < uVar4) {
                pIVar34[uVar39 - 1].length = uVar4;
                uVar41 = uVar4;
              }
              else {
                pIVar34[uVar39 - 1].flags = bVar3 & 0xef;
              }
            }
            pIVar34[uVar39 - 1].global_volume = '@';
            pIVar31 = pIVar34 + (uVar39 - 1);
            pIVar31->vibrato_speed = '\0';
            pIVar31->vibrato_depth = '\0';
            pIVar31->vibrato_rate = '\0';
            pIVar31->vibrato_waveform = '\0';
            pIVar34[uVar39 - 1].max_resampling_quality = -1;
            iVar61 = uVar41 << (sbyte)((bVar2 & 4) >> 2);
            pvVar35 = malloc((long)iVar61);
            pIVar34[uVar39 - 1].data = pvVar35;
            if (((pvVar35 == (void *)0x0) || (iVar59 = dumbfile_seek(f,(long)iVar59,0), iVar59 != 0)
                ) || (iVar33 = dumbfile_getnc((char *)pIVar34[uVar39 - 1].data,iVar61,f),
                     iVar33 < iVar61)) goto LAB_0070e2d6;
            pvVar35 = pIVar34[uVar39 - 1].data;
            if ((bVar2 & 0x10) == 0) {
              uVar41 = pIVar34[uVar39 - 1].length;
              if ((bVar2 & 8) == 0) {
                if ((bVar2 & 4) == 0) {
                  if (0 < (int)uVar41) {
                    lVar36 = 0;
                    cVar37 = '\0';
                    do {
                      cVar37 = cVar37 + *(char *)((long)pvVar35 + lVar36);
                      *(char *)((long)pIVar34[uVar39 - 1].data + lVar36) = cVar37;
                      lVar36 = lVar36 + 1;
                    } while (lVar36 < pIVar34[uVar39 - 1].length);
                  }
                }
                else if (0 < (int)uVar41) {
                  uVar39 = 0;
                  sVar42 = 0;
                  do {
                    sVar42 = sVar42 + *(short *)((long)pvVar35 + uVar39 * 2);
                    *(short *)((long)pvVar35 + uVar39 * 2) = sVar42;
                    uVar39 = uVar39 + 1;
                  } while (uVar41 != uVar39);
                }
              }
              else if ((bVar2 & 4) == 0) {
                if (0 < (int)uVar41) {
                  lVar36 = 0;
                  cVar37 = '\0';
                  do {
                    cVar37 = cVar37 + *(char *)((long)pvVar35 + lVar36);
                    *(char *)((long)pIVar34[uVar39 - 1].data + lVar36) = cVar37 + -0x80;
                    lVar36 = lVar36 + 1;
                  } while (lVar36 < pIVar34[uVar39 - 1].length);
                }
              }
              else if (0 < (int)uVar41) {
                uVar39 = 0;
                uVar43 = 0;
                do {
                  uVar43 = uVar43 + *(short *)((long)pvVar35 + uVar39 * 2);
                  *(ushort *)((long)pvVar35 + uVar39 * 2) = uVar43 ^ 0x8000;
                  uVar39 = uVar39 + 1;
                } while (uVar41 != uVar39);
              }
            }
            else if ((bVar2 & 8) == 0) {
              if (((bVar2 & 4) != 0) && (0 < (long)pIVar34[uVar39 - 1].length)) {
                lVar36 = 0;
                do {
                  lVar36 = lVar36 + 1;
                } while (pIVar34[uVar39 - 1].length != lVar36);
              }
            }
            else {
              uVar41 = pIVar34[uVar39 - 1].length;
              if ((bVar2 & 4) == 0) {
                if (0 < (int)uVar41) {
                  lVar36 = 0;
                  do {
                    *(char *)((long)pIVar34[uVar39 - 1].data + lVar36) =
                         *(char *)((long)pvVar35 + lVar36) + -0x80;
                    lVar36 = lVar36 + 1;
                  } while (lVar36 < pIVar34[uVar39 - 1].length);
                }
              }
              else if (0 < (int)uVar41) {
                uVar39 = 0;
                do {
                  pbVar1 = (byte *)((long)pvVar35 + uVar39 * 2 + 1);
                  *pbVar1 = *pbVar1 ^ 0x80;
                  uVar39 = uVar39 + 1;
                } while (uVar41 != uVar39);
              }
            }
          }
          else {
            pIVar34[uVar39 - 1].flags = bVar3 & 0xfe;
          }
        }
        sVar46 = sVar46 + 1;
      } while (sVar46 != __nmemb);
    }
    free(ptr);
    iVar59 = 0;
  }
  return iVar59;
}

Assistant:

static int it_old_psm_read_samples(IT_SAMPLE ** sample, DUMBFILE * f, int * num)
{
    int n, o, count = *num, true_num, snum, offset, flags, finetune, delta;

    unsigned char * buffer;
	const unsigned char * sdata;
    int32 sample_bytes;

	buffer = malloc(count * 64);
	if (!buffer) goto error;

    if (dumbfile_getnc((char *)buffer, count * 64, f) < count * 64) goto error_fb;

	true_num = 0;

	for (n = 0; n < count; n++) {
		snum = buffer[(n * 64) + 45] | (buffer[(n * 64) + 46] << 8);
		if ((snum < 1) || (snum > 255)) goto error_fb;
		if (true_num < snum) true_num = snum;
	}

	if (true_num > count) {
		IT_SAMPLE * meh = realloc(*sample, true_num * sizeof(*meh));
		if (!meh) goto error_fb;
		for (n = count; n < true_num; n++) {
			meh[n].data = NULL;
		}
		*sample = meh;
		*num = true_num;
	}

	qsort(buffer, count, 64, &psm_sample_compare);

	for (n = 0; n < true_num; n++) {
		(*sample)[n].flags = 0;
	}

	for (n = 0; n < count; n++) {
		IT_SAMPLE * s;
		snum = buffer[(n * 64) + 45] | (buffer[(n * 64) + 46] << 8);
		s = &((*sample)[snum - 1]);
		memcpy(s->filename, buffer + (n * 64), 13);
		s->filename[13] = 0;
		memcpy(s->name, buffer + (n * 64) + 13, 24);
		s->name[24] = 0;
		offset = buffer[(n * 64) + 37] | (buffer[(n * 64) + 38] << 8) |
				 (buffer[(n * 64) + 39] << 16) | (buffer[(n * 64) + 40] << 24);
		flags = buffer[(n * 64) + 47];
		s->length = buffer[(n * 64) + 48] | (buffer[(n * 64) + 49] << 8) |
					(buffer[(n * 64) + 50] << 16) | (buffer[(n * 64) + 51] << 24);
		s->loop_start = buffer[(n * 64) + 52] | (buffer[(n * 64) + 53] << 8) |
						(buffer[(n * 64) + 54] << 16) | (buffer[(n * 64) + 55] << 24);
		s->loop_end = buffer[(n * 64) + 56] | (buffer[(n * 64) + 57] << 8) |
					  (buffer[(n * 64) + 58] << 16) | (buffer[(n * 64) + 59] << 24);

		if (s->length <= 0) continue;

		finetune = buffer[(n * 64) + 60];
		s->default_volume = buffer[(n * 64) + 61];
		s->C5_speed = buffer[(n * 64) + 62] | (buffer[(n * 64) + 63] << 8);
		if (finetune & 15) {
			finetune &= 15;
			if (finetune >= 8) finetune -= 16;
			//s->C5_speed = (long)((double)s->C5_speed * pow(DUMB_PITCH_BASE, finetune*32));
			s->finetune = finetune * 32;
		}
		else s->finetune = 0;

		s->flags |= IT_SAMPLE_EXISTS;
		if (flags & 0x41) {
			s->flags &= ~IT_SAMPLE_EXISTS;
			continue;
		}
		if (flags & 0x20) s->flags |= IT_SAMPLE_PINGPONG_LOOP;
		if (flags & 4) s->flags |= IT_SAMPLE_16BIT;

		if (flags & 0x80) {
			s->flags |= IT_SAMPLE_LOOP;
			if ((unsigned int)s->loop_end > (unsigned int)s->length)
				s->loop_end = s->length;
			else if ((unsigned int)s->loop_start >= (unsigned int)s->loop_end)
				s->flags &= ~IT_SAMPLE_LOOP;
			else
				s->length = s->loop_end;
		}

		s->global_volume = 64;

		s->vibrato_speed = 0;
		s->vibrato_depth = 0;
		s->vibrato_rate = 0;
		s->vibrato_waveform = IT_VIBRATO_SINE;
		s->max_resampling_quality = -1;

        sample_bytes = s->length * ((flags & 4) ? 2 : 1);
        s->data = malloc(sample_bytes);
		if (!s->data) goto error_fb;

        if (dumbfile_seek(f, offset, DFS_SEEK_SET) || dumbfile_getnc(s->data, sample_bytes, f) < sample_bytes) goto error_fb;
        sdata = ( const unsigned char * ) s->data;

		if (flags & 0x10) {
			if (flags & 8) {
				if (flags & 4) {
					for (o = 0; o < s->length; o++)
						((short *)s->data)[o] = (sdata[o * 2] | (sdata[(o * 2) + 1] << 8)) ^ 0x8000;
				} else {
					for (o = 0; o < s->length; o++)
						((signed char *)s->data)[o] = sdata[o] ^ 0x80;
				}
			} else {
				if (flags & 4) {
					for (o = 0; o < s->length; o++)
						((short *)s->data)[o] = sdata[o * 2] | (sdata[(o * 2) + 1] << 8);
				} else {
					memcpy(s->data, sdata, s->length);
				}
			}
		} else {
			delta = 0;
			if (flags & 8) {
				/* unsigned delta? mehhh, does anything even use this? */
				if (flags & 4) {
					for (o = 0; o < s->length; o++) {
						delta += (short)(sdata[o * 2] | (sdata[(o * 2) + 1] << 8));
						((short *)s->data)[o] = delta ^ 0x8000;
					}
				} else {
					for (o = 0; o < s->length; o++) {
						delta += (signed char)sdata[o];
						((signed char *)s->data)[o] = delta ^ 0x80;
					}
				}
			} else {
				if (flags & 4) {
					for (o = 0; o < s->length; o++) {
						delta += (short)(sdata[o * 2] | (sdata[(o * 2) + 1] << 8));
						((short *)s->data)[o] = delta;
					}
				} else {
					for (o = 0; o < s->length; o++) {
						delta += (signed char)sdata[o];
						((signed char *)s->data)[o] = delta;
					}
				}
			}
		}
	}

	free(buffer);

	return 0;

error_fb:
	free(buffer);
error:
	return -1;
}